

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_SubDDisplayParameters *
ON_SubDDisplayParameters::CreateFromDisplayDensity
          (ON_SubDDisplayParameters *__return_storage_ptr__,uint adaptive_subd_display_density)

{
  uint adaptive_subd_display_density_local;
  
  if (adaptive_subd_display_density < 7) {
    ON_SubDDisplayParameters(__return_storage_ptr__);
    __return_storage_ptr__->m_display_density = (uchar)adaptive_subd_display_density;
    __return_storage_ptr__->m_bDisplayDensityIsAbsolute = false;
  }
  else {
    ON_SubDIncrementErrorCount();
    memcpy(__return_storage_ptr__,&Default,0x40);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDDisplayParameters ON_SubDDisplayParameters::CreateFromDisplayDensity(
  unsigned int adaptive_subd_display_density
)
{
  if (adaptive_subd_display_density > ON_SubDDisplayParameters::MaximumDensity)
    return ON_SUBD_RETURN_ERROR(ON_SubDDisplayParameters::Default);

  ON_SubDDisplayParameters limit_mesh_parameters;
  limit_mesh_parameters.m_display_density = (unsigned char)adaptive_subd_display_density;
  limit_mesh_parameters.m_bDisplayDensityIsAbsolute = false;
  return limit_mesh_parameters;
}